

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  uint8_t *puVar2;
  LogMessage *other;
  int iVar3;
  int iVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  bVar1 = this->legitimate_message_end_;
  this->current_limit_ = limit;
  puVar2 = this->buffer_end_;
  this->buffer_end_ = puVar2 + this->buffer_size_after_limit_;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar3 = this->total_bytes_read_ - limit;
  iVar4 = 0;
  if (iVar3 != 0 && limit <= this->total_bytes_read_) {
    this->buffer_end_ = puVar2 + this->buffer_size_after_limit_ + -(long)iVar3;
    iVar4 = iVar3;
  }
  this->buffer_size_after_limit_ = iVar4;
  this->legitimate_message_end_ = false;
  iVar4 = this->recursion_budget_;
  if (this->recursion_limit_ <= iVar4) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0xa1);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (recursion_budget_) < (recursion_limit_): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    iVar4 = this->recursion_budget_;
  }
  this->recursion_budget_ = iVar4 + 1;
  return bVar1;
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  GOOGLE_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}